

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stmt.cc
# Opt level: O0

void __thiscall
kratos::InterfaceInstantiationStmt::InterfaceInstantiationStmt
          (InterfaceInstantiationStmt *this,Generator *parent,InterfaceRef *interface)

{
  Port *port_00;
  bool bVar1;
  unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_kratos::Port_*,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_kratos::Port_*>_>_>
  *this_00;
  reference __in;
  type *ppPVar2;
  string *target_name;
  bool *pbVar3;
  type *port;
  type *port_name;
  _Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_kratos::Port_*>,_true>
  local_48;
  const_iterator __end1;
  const_iterator __begin1;
  unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_kratos::Port_*,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_kratos::Port_*>_>_>
  *__range1;
  InterfaceRef *interface_local;
  Generator *parent_local;
  InterfaceInstantiationStmt *this_local;
  
  Stmt::Stmt(&this->super_Stmt,InterfaceInstantiation);
  InstantiationStmt::InstantiationStmt(&this->super_InstantiationStmt);
  (this->super_Stmt).super_IRNode._vptr_IRNode = (_func_int **)&PTR_accept_005c8e70;
  (this->super_InstantiationStmt)._vptr_InstantiationStmt =
       (_func_int **)&PTR_instantiation_type_005c8ef0;
  this->interface_ = interface;
  this_00 = InterfaceRef::ports_abi_cxx11_(interface);
  __end1 = std::
           unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_kratos::Port_*,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_kratos::Port_*>_>_>
           ::begin(this_00);
  local_48._M_cur =
       (__node_type *)
       std::
       unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_kratos::Port_*,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_kratos::Port_*>_>_>
       ::end(this_00);
  while( true ) {
    bVar1 = std::__detail::operator!=
                      (&__end1.
                        super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_kratos::Port_*>,_true>
                       ,&local_48);
    if (!bVar1) break;
    __in = std::__detail::
           _Node_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_kratos::Port_*>,_false,_true>
           ::operator*(&__end1);
    std::get<0ul,std::__cxx11::string_const,kratos::Port*>(__in);
    ppPVar2 = std::get<1ul,std::__cxx11::string_const,kratos::Port*>(__in);
    port_00 = *ppPVar2;
    target_name = InterfaceRef::name_abi_cxx11_(interface);
    InstantiationStmt::process_port(&this->super_InstantiationStmt,port_00,parent,target_name);
    std::__detail::
    _Node_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_kratos::Port_*>,_false,_true>
    ::operator++(&__end1);
  }
  pbVar3 = InterfaceRef::has_instantiated(interface);
  *pbVar3 = true;
  return;
}

Assistant:

InterfaceInstantiationStmt::InterfaceInstantiationStmt(kratos::Generator *parent,
                                                       kratos::InterfaceRef *interface)
    : Stmt(StatementType::InterfaceInstantiation), interface_(interface) {
    for (auto const &[port_name, port] : interface->ports()) {
        process_port(port, parent, interface->name());
    }
    interface->has_instantiated() = true;
}